

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.cpp
# Opt level: O1

hugeint_t duckdb::DecimalMultiplyOverflowCheck::
          Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (hugeint_t left,hugeint_t right)

{
  bool bVar1;
  OutOfRangeException *this;
  int64_t in_RCX;
  uint64_t in_RDX;
  int64_t in_RSI;
  uint64_t in_RDI;
  hugeint_t left_00;
  hugeint_t right_00;
  hugeint_t result;
  hugeint_t local_b0;
  hugeint_t local_a0;
  hugeint_t local_90;
  string local_80;
  string local_60;
  string local_40;
  
  left_00.upper = in_RSI;
  left_00.lower = in_RDI;
  right_00.upper = in_RCX;
  right_00.lower = in_RDX;
  bVar1 = TryDecimalMultiply::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (left_00,right_00,&local_90);
  if (bVar1) {
    return local_90;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,
             "Overflow in multiplication of DECIMAL(38) (%s * %s). You might want to add an explicit cast to a decimal with a smaller scale."
             ,"");
  hugeint_t::ToString_abi_cxx11_(&local_40,&local_a0);
  hugeint_t::ToString_abi_cxx11_(&local_60,&local_b0);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_80,&local_40,&local_60);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

hugeint_t DecimalMultiplyOverflowCheck::Operation(hugeint_t left, hugeint_t right) {
	hugeint_t result;
	if (!TryDecimalMultiply::Operation(left, right, result)) {
		throw OutOfRangeException("Overflow in multiplication of DECIMAL(38) (%s * %s). You might want to add an "
		                          "explicit cast to a decimal with a smaller scale.",
		                          left.ToString(), right.ToString());
	}
	return result;
}